

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> * __thiscall
testing::internal::OnCallSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
GetAction(OnCallSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  OnCallSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *local_10;
  OnCallSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_local;
  
  iVar1 = *(int *)(this + 0xc);
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_30,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_31);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return (Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *)
         (this + 0x40);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }